

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::MenuItemEx(char *label,char *icon,char *shortcut,bool selected,bool enabled)

{
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImGuiContext *pIVar1;
  byte bVar2;
  byte bVar3;
  ImGuiWindow *pIVar4;
  byte in_CL;
  char *in_RDX;
  char *in_RSI;
  byte in_R8B;
  ImVec2 IVar5;
  ImVec2 IVar6;
  float stretch_w;
  float min_w;
  float checkmark_w;
  float shortcut_w;
  float icon_w;
  ImVec2 text_pos;
  float w;
  ImGuiMenuColumns *offsets;
  ImGuiSelectableFlags selectable_flags;
  bool pressed;
  bool menuset_is_open;
  ImVec2 label_size;
  ImVec2 pos;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  ImGuiMenuColumns *in_stack_fffffffffffffee0;
  int iVar7;
  ImVec4 *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  ImVec2 *this;
  ImGuiCol idx;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff0c;
  undefined1 hide_text_after_hash;
  undefined4 in_stack_ffffffffffffff10;
  float sz;
  ImU32 in_stack_ffffffffffffff14;
  ImU32 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImVec2 local_bc;
  ImVec2 local_b4;
  float local_ac;
  float local_a8;
  float local_a4;
  ImVec2 local_a0;
  float local_98;
  ImVec2 local_94;
  float local_8c;
  ImVec2 local_88;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  float local_64;
  ImGuiMenuColumns *local_60;
  undefined4 uVar8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  bool local_1;
  
  hide_text_after_hash = (undefined1)((uint)in_stack_ffffffffffffff0c >> 0x18);
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    IVar6 = (pIVar4->DC).CursorPos;
    IVar5 = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         in_stack_fffffffffffffef0,SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0)
                         ,SUB84(in_stack_fffffffffffffee8,0));
    bVar2 = IsRootOfOpenMenuSet();
    if ((bool)bVar2) {
      PushItemFlag((ImGuiItemFlags)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffed0 >> 0x18,0));
    }
    PushID((char *)in_stack_fffffffffffffee0);
    if ((in_R8B & 1) == 0) {
      BeginDisabled(SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
    }
    uVar8 = 0x14800000;
    local_60 = &(pIVar4->DC).MenuColumns;
    if ((pIVar4->DC).LayoutType == 0) {
      local_64 = IVar5.x;
      (pIVar4->DC).CursorPos.x =
           (float)(int)((pIVar1->Style).ItemSpacing.x * 0.5) + (pIVar4->DC).CursorPos.x;
      ImVec2::ImVec2(&local_6c,
                     (pIVar4->DC).CursorPos.x + (float)(pIVar4->DC).MenuColumns.OffsetLabel,
                     (pIVar4->DC).CursorPos.y + (pIVar4->DC).CurrLineTextBaseOffset);
      iVar7 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      ImVec2::ImVec2(&local_74,(pIVar1->Style).ItemSpacing.x * 2.0,(pIVar1->Style).ItemSpacing.y);
      PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffff04,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      ImVec2::ImVec2(&local_7c,local_64,0.0);
      bVar3 = Selectable((char *)IVar6,IVar5.y._3_1_,(ImGuiSelectableFlags)IVar5.x,
                         (ImVec2 *)
                         CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT24(in_stack_ffffffffffffffac,uVar8))));
      PopStyleVar(iVar7);
      if (((pIVar1->LastItemData).StatusFlags & 0x200U) != 0) {
        local_88 = local_6c;
        pos_00.y = in_stack_ffffffffffffff24;
        pos_00.x = in_stack_ffffffffffffff20;
        RenderText(pos_00,(char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (bool)hide_text_after_hash);
      }
      (pIVar4->DC).CursorPos.x =
           (float)(int)((pIVar1->Style).ItemSpacing.x * -0.5) + (pIVar4->DC).CursorPos.x;
    }
    else {
      if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
        local_8c = 0.0;
      }
      else {
        local_94 = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ),in_stack_fffffffffffffef0,
                                SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
                                SUB84(in_stack_fffffffffffffee8,0));
        local_8c = local_94.x;
      }
      if ((in_RDX == (char *)0x0) || (*in_RDX == '\0')) {
        local_98 = 0.0;
      }
      else {
        local_a0 = CalcTextSize((char *)CONCAT44(local_8c,in_stack_fffffffffffffef8),
                                in_stack_fffffffffffffef0,
                                SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
                                SUB84(in_stack_fffffffffffffee8,0));
        local_98 = local_a0.x;
      }
      local_a4 = (float)(int)(pIVar1->FontSize * 1.2);
      local_a8 = ImGuiMenuColumns::DeclColumns
                           (in_stack_fffffffffffffee0,
                            (float)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                            (float)in_stack_fffffffffffffed8,
                            (float)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                            (float)in_stack_fffffffffffffed0);
      iVar7 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
      local_b4 = GetContentRegionAvail();
      local_ac = ImMax<float>(0.0,local_b4.x - local_a8);
      ImVec2::ImVec2(&local_bc,local_a8,0.0);
      bVar3 = Selectable((char *)IVar6,IVar5.y._3_1_,(ImGuiSelectableFlags)IVar5.x,
                         (ImVec2 *)
                         CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT24(in_stack_ffffffffffffffac,uVar8))));
      if (((pIVar1->LastItemData).StatusFlags & 0x200U) != 0) {
        this = &local_cc;
        ImVec2::ImVec2(this,(float)local_60->OffsetLabel,0.0);
        idx = (ImGuiCol)((ulong)this >> 0x20);
        local_c4 = ::operator+(in_stack_fffffffffffffec8,(ImVec2 *)0x50baea);
        IVar6.y = in_stack_ffffffffffffff24;
        IVar6.x = in_stack_ffffffffffffff20;
        RenderText(IVar6,(char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (bool)hide_text_after_hash);
        if (0.0 < local_8c) {
          in_stack_fffffffffffffee8 = (ImVec4 *)&stack0xffffffffffffff24;
          ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffee8,(float)local_60->OffsetIcon,0.0);
          ::operator+(in_stack_fffffffffffffec8,(ImVec2 *)0x50bb51);
          IVar5.y = in_stack_ffffffffffffff24;
          IVar5.x = in_stack_ffffffffffffff20;
          RenderText(IVar5,(char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (bool)hide_text_after_hash);
        }
        if (0.0 < local_98) {
          PushStyleColor(idx,in_stack_fffffffffffffee8);
          in_stack_fffffffffffffee0 = (ImGuiMenuColumns *)&stack0xffffffffffffff14;
          ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffee0,
                         (float)local_60->OffsetShortcut + local_ac,0.0);
          IVar6 = ::operator+(in_stack_fffffffffffffec8,(ImVec2 *)0x50bbdb);
          in_stack_ffffffffffffff1c = IVar6.x;
          in_stack_ffffffffffffff20 = IVar6.y;
          pos_01.y = in_stack_ffffffffffffff24;
          pos_01.x = in_stack_ffffffffffffff20;
          RenderText(pos_01,(char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (bool)hide_text_after_hash);
          PopStyleColor(iVar7);
        }
        if ((in_CL & 1) != 0) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff04,
                         pIVar1->FontSize * 0.4 + (float)local_60->OffsetMark + local_ac,
                         pIVar1->FontSize * 0.134 * 0.5);
          IVar6 = ::operator+(in_stack_fffffffffffffec8,(ImVec2 *)0x50bc9d);
          sz = IVar6.y;
          GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                      SUB84(in_stack_fffffffffffffee0,0));
          pos_02.y = in_stack_ffffffffffffff24;
          pos_02.x = in_stack_ffffffffffffff20;
          RenderCheckMark((ImDrawList *)
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),pos_02,
                          in_stack_ffffffffffffff14,sz);
        }
      }
    }
    if ((in_R8B & 1) == 0) {
      EndDisabled();
    }
    PopID();
    if ((bVar2 & 1) != 0) {
      PopItemFlag();
    }
    local_1 = (bool)(bVar3 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::MenuItemEx(const char* label, const char* icon, const char* shortcut, bool selected, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 pos = window->DC.CursorPos;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    // See BeginMenuEx() for comments about this.
    const bool menuset_is_open = IsRootOfOpenMenuSet();
    if (menuset_is_open)
        PushItemFlag(ImGuiItemFlags_NoWindowHoverableCheck, true);

    // We've been using the equivalent of ImGuiSelectableFlags_SetNavIdOnHover on all Selectable() since early Nav system days (commit 43ee5d73),
    // but I am unsure whether this should be kept at all. For now moved it to be an opt-in feature used by menus only.
    bool pressed;
    PushID(label);
    if (!enabled)
        BeginDisabled();

    // We use ImGuiSelectableFlags_NoSetKeyOwner to allow down on one menu item, move, up on another.
    const ImGuiSelectableFlags selectable_flags = ImGuiSelectableFlags_SelectOnRelease | ImGuiSelectableFlags_NoSetKeyOwner | ImGuiSelectableFlags_SetNavIdOnHover;
    const ImGuiMenuColumns* offsets = &window->DC.MenuColumns;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Mimic the exact layout spacing of BeginMenu() to allow MenuItem() inside a menu bar, which is a little misleading but may be useful
        // Note that in this situation: we don't render the shortcut, we render a highlight instead of the selected tick mark.
        float w = label_size.x;
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        pressed = Selectable("", selected, selectable_flags, ImVec2(w, 0.0f));
        PopStyleVar();
        if (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_Visible)
            RenderText(text_pos, label);
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu item inside a vertical menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        float icon_w = (icon && icon[0]) ? CalcTextSize(icon, NULL).x : 0.0f;
        float shortcut_w = (shortcut && shortcut[0]) ? CalcTextSize(shortcut, NULL).x : 0.0f;
        float checkmark_w = IM_FLOOR(g.FontSize * 1.20f);
        float min_w = window->DC.MenuColumns.DeclColumns(icon_w, label_size.x, shortcut_w, checkmark_w); // Feedback for next frame
        float stretch_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        pressed = Selectable("", false, selectable_flags | ImGuiSelectableFlags_SpanAvailWidth, ImVec2(min_w, 0.0f));
        if (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_Visible)
        {
            RenderText(pos + ImVec2(offsets->OffsetLabel, 0.0f), label);
            if (icon_w > 0.0f)
                RenderText(pos + ImVec2(offsets->OffsetIcon, 0.0f), icon);
            if (shortcut_w > 0.0f)
            {
                PushStyleColor(ImGuiCol_Text, style.Colors[ImGuiCol_TextDisabled]);
                RenderText(pos + ImVec2(offsets->OffsetShortcut + stretch_w, 0.0f), shortcut, NULL, false);
                PopStyleColor();
            }
            if (selected)
                RenderCheckMark(window->DrawList, pos + ImVec2(offsets->OffsetMark + stretch_w + g.FontSize * 0.40f, g.FontSize * 0.134f * 0.5f), GetColorU32(ImGuiCol_Text), g.FontSize * 0.866f);
        }
    }
    IMGUI_TEST_ENGINE_ITEM_INFO(g.LastItemData.ID, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Checkable | (selected ? ImGuiItemStatusFlags_Checked : 0));
    if (!enabled)
        EndDisabled();
    PopID();
    if (menuset_is_open)
        PopItemFlag();

    return pressed;
}